

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void dequantize_row_iq4_xs(block_iq4_xs *x,float *y,int64_t k)

{
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar1;
  float fVar2;
  int j;
  float dl;
  int ls;
  int ib;
  float d;
  uint8_t *qs;
  int i;
  int64_t nb;
  int local_44;
  int local_38;
  long local_30;
  int local_24;
  long local_10;
  
  local_10 = in_RSI;
  for (local_24 = 0; (long)local_24 < in_RDX / 0x100; local_24 = local_24 + 1) {
    local_30 = in_RDI + (long)local_24 * 0x88 + 8;
    fVar1 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_RDI + (long)local_24 * 0x88));
    for (local_38 = 0; local_38 < 8; local_38 = local_38 + 1) {
      fVar2 = fVar1 * (float)(int)(((int)(uint)*(byte *)(in_RDI + (long)local_24 * 0x88 + 4 +
                                                        (long)(local_38 / 2)) >>
                                    ((byte)(local_38 % 2 << 2) & 0x1f) & 0xfU |
                                   ((int)(uint)*(ushort *)(in_RDI + (long)local_24 * 0x88 + 2) >>
                                    ((byte)(local_38 << 1) & 0x1f) & 3U) << 4) - 0x20);
      for (local_44 = 0; local_44 < 0x10; local_44 = local_44 + 1) {
        *(float *)(local_10 + (long)local_44 * 4) =
             fVar2 * (float)(int)kvalues_iq4nl[(int)(*(byte *)(local_30 + local_44) & 0xf)];
        *(float *)(local_10 + (long)(local_44 + 0x10) * 4) =
             fVar2 * (float)(int)kvalues_iq4nl[(int)(uint)*(byte *)(local_30 + local_44) >> 4];
      }
      local_10 = local_10 + 0x80;
      local_30 = local_30 + 0x10;
    }
  }
  return;
}

Assistant:

void dequantize_row_iq4_xs(const block_iq4_xs * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    for (int i = 0; i < nb; i++) {

        const uint8_t * qs = x[i].qs;

        const float d = GGML_FP16_TO_FP32(x[i].d);

        for (int ib = 0; ib < QK_K/32; ++ib) {
            const int ls = ((x[i].scales_l[ib/2] >> 4*(ib%2)) & 0xf) | (((x[i].scales_h >> 2*ib) & 3) << 4);
            const float dl = d * (ls - 32);
            for (int j = 0; j < 16; ++j) {
                y[j+ 0] = dl * kvalues_iq4nl[qs[j] & 0xf];
                y[j+16] = dl * kvalues_iq4nl[qs[j] >>  4];
            }
            y  += 32;
            qs += 16;
        }
    }
}